

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# asp_preprocessor.cpp
# Opt level: O2

ValueRep __thiscall Clasp::Asp::Preprocessor::simplifyHead(Preprocessor *this,PrgHead *h,bool more)

{
  uint uVar1;
  EdgeType EVar2;
  PrgNode PVar3;
  PrgNode PVar4;
  PrgEdge *first;
  bool bVar5;
  ValueRep VVar6;
  byte v;
  EdgeType EVar7;
  long lVar8;
  uint32 uVar9;
  PrgBody *pPVar10;
  allocator_type local_45;
  uint32 numSuppLits;
  EdgeVec temp;
  
  PVar3 = h->super_PrgNode;
  if ((PVar3._0_4_ & 0x7fffffff) == 1 || ((ulong)PVar3 >> 0x3e & 1) != 0) {
    h->super_PrgNode = (PrgNode)(((ulong)PVar3 & 0xffffffff80000000) + 1);
    PrgNode::markRemoved(&h->super_PrgNode);
    PrgHead::clearSupports(h);
    h->field_0x1b = h->field_0x1b & 0xf7;
    VVar6 = '\x01';
  }
  else {
    if ((h->supports_).ebo_.size == 0) {
      uVar9 = 0xffffffff;
    }
    else {
      uVar9 = ((h->supports_).ebo_.buf)->rep;
    }
    numSuppLits = 0;
    bVar5 = PrgHead::simplifySupports(h,this->prg_,true,&numSuppLits);
    VVar6 = '\x02';
    if (bVar5) {
      PVar4 = h->super_PrgNode;
      v = PVar4._7_1_ >> 4 & 3;
      VVar6 = '\x01';
      if (((PVar3._7_1_ >> 4 & 3) != v) &&
         ((v == 2 || ((v == 1 && (((ulong)PVar4 & 0x7ffffffe) != 0)))))) {
        VVar6 = '\x03';
      }
      if (more) {
        if ((PVar4._0_4_ & 0x7fffffff) == 1 || numSuppLits != 0) {
          uVar1 = (h->supports_).ebo_.size;
          if ((ulong)uVar1 == 0) {
            return VVar6;
          }
          first = (h->supports_).ebo_.buf;
          if (first->rep == uVar9) {
            if (uVar1 != 1 || (uVar9 & 2) != 0) {
              if (numSuppLits != 1 || uVar1 == 1) {
                return VVar6;
              }
              if (-1 < *(int *)&h->field_0x18) {
                return VVar6;
              }
            }
            pPVar10 = (this->prg_->bodies_).ebo_.buf[uVar9 >> 4];
            if (((PVar4._0_4_ ^ *(uint *)&pPVar10->super_PrgNode) & 0x7fffffff) == 0) {
              return VVar6;
            }
            if (uVar1 != 1) {
              bk_lib::pod_vector<Clasp::Asp::PrgEdge,std::allocator<Clasp::Asp::PrgEdge>>::
              pod_vector<Clasp::Asp::PrgEdge_const*>
                        ((pod_vector<Clasp::Asp::PrgEdge,std::allocator<Clasp::Asp::PrgEdge>> *)
                         &temp,first,first + uVar1,&local_45,(type_conflict *)0x0);
              PrgHead::clearSupports(h);
              EVar7 = (temp.ebo_.buf)->rep;
              for (lVar8 = 0; (ulong)temp.ebo_.size << 2 != lVar8; lVar8 = lVar8 + 4) {
                EVar2 = *(EdgeType *)((long)&(temp.ebo_.buf)->rep + lVar8);
                pPVar10 = (this->prg_->bodies_).ebo_.buf[EVar2 >> 4];
                if ((((EVar2 & Choice) == Normal) &&
                    ((*(uint *)&pPVar10->field_0x8 & 0x1ffffff) == 1)) &&
                   (((ulong)(&pPVar10[1].super_PrgNode)
                            [(*(uint *)&pPVar10->field_0x8 & 0x18000000) != 0] & 2) != 0)) {
                  EVar7 = EVar2;
                }
                PrgBody::removeHead(pPVar10,h,EVar2 & GammaChoice);
              }
              pPVar10 = (this->prg_->bodies_).ebo_.buf[EVar7 >> 4];
              PrgBody::addHead(pPVar10,h,EVar7 & GammaChoice);
              bVar5 = PrgBody::simplifyHeads(pPVar10,this->prg_,true);
              bk_lib::pod_vector<Clasp::Asp::PrgEdge,_std::allocator<Clasp::Asp::PrgEdge>_>::ebo::
              ~ebo(&temp.ebo_);
              if (!bVar5) {
                return '\x02';
              }
              v = SUB81(h->super_PrgNode,7) >> 4 & 3;
            }
            if ((v | 2) == 3) {
              PrgBody::assignValue(pPVar10,v);
              PrgBody::propagateValue(pPVar10,this->prg_,true);
            }
          }
        }
        VVar6 = '\x03';
      }
    }
  }
  return VVar6;
}

Assistant:

ValueRep Preprocessor::simplifyHead(PrgHead* h, bool more) {
	if (!h->hasVar() || !h->relevant()) {
		// unsupported or eq
		h->clearLiteral(false);
		h->markRemoved();
		h->clearSupports();
		h->setInUpper(false);
		return value_true;
	}
	assert(h->inUpper());
	ValueRep v       = h->value();
	ValueRep ret     = value_true;
	PrgEdge support  = h->supports() ? *h->supps_begin() : PrgEdge::noEdge();
	uint32 numSuppLits= 0;
	if (!h->simplifySupports(*prg_, true, &numSuppLits)) {
		return value_false;
	}
	if (v != h->value() && (h->value() == value_false || (h->value() == value_true && h->var() != 0))) {
		ret = value_weak_true;
	}
	if (more) {
		if (numSuppLits == 0 && h->hasVar()) {
			// unsupported head does not need a variable
			ret = value_weak_true;
		}
		else if (h->supports() > 0 && h->supps_begin()->rep != support.rep) {
			// support for head has changed
			ret = value_weak_true;
		}
		else if ((support.isNormal() && h->supports() == 1) || (h->supports() > 1 && numSuppLits == 1 && h->isAtom())) {
			assert(support.isBody());
			PrgBody* supBody = prg_->getBody(support.node());
			if (supBody->literal() != h->literal()) {
				if (h->supports() > 1) {
					// atom is equivalent to one of its bodies
					EdgeVec temp(h->supps_begin(), h->supps_end());
					h->clearSupports();
					support = temp[0];
					for (EdgeIterator it = temp.begin(), end = temp.end(); it != end; ++it) {
						assert(!it->isDisj());
						PrgBody* B = prg_->getBody(it->node());
						if (it->isNormal() && B->size() == 1 && B->goal(0).sign()) {
							support = *it;
						}
						B->removeHead(h, it->type());
					}
					supBody = prg_->getBody(support.node());
					supBody->addHead(h, support.type());
					if (!supBody->simplifyHeads(*prg_, true)) {
						return value_false;
					}
				}
				ret = value_weak_true;
				if (h->value() == value_weak_true || h->value() == value_true) {
					supBody->assignValue(h->value());
					supBody->propagateValue(*prg_, true);
				}
			}
		}
	}
	return ret;
}